

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_enum_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cxx::RepeatedEnumFieldGenerator::GenerateAccessorDeclarations
          (RepeatedEnumFieldGenerator *this,Printer *printer)

{
  io::Printer::Print(printer,&this->variables_,
                     "inline $type$ $name$(int index) const$deprecation$;\ninline void set_$name$(int index, $type$ value)$deprecation$;\ninline void add_$name$($type$ value)$deprecation$;\n"
                    );
  io::Printer::Print(printer,&this->variables_,
                     "inline const ::google::protobuf::RepeatedField<int>& $name$() const$deprecation$;\ninline ::google::protobuf::RepeatedField<int>* mutable_$name$()$deprecation$;\n"
                    );
  return;
}

Assistant:

void RepeatedEnumFieldGenerator::
GenerateAccessorDeclarations(io::Printer* printer) const {
  printer->Print(variables_,
    "inline $type$ $name$(int index) const$deprecation$;\n"
    "inline void set_$name$(int index, $type$ value)$deprecation$;\n"
    "inline void add_$name$($type$ value)$deprecation$;\n");
  printer->Print(variables_,
    "inline const ::google::protobuf::RepeatedField<int>& $name$() const$deprecation$;\n"
    "inline ::google::protobuf::RepeatedField<int>* mutable_$name$()$deprecation$;\n");
}